

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O1

int CBS_get_u16le(CBS *cbs,uint16_t *out)

{
  ulong uVar1;
  uint8_t *puVar2;
  ushort in_DX;
  long lVar3;
  
  uVar1 = cbs->len;
  if (1 < uVar1) {
    puVar2 = cbs->data;
    cbs->data = puVar2 + 2;
    cbs->len = uVar1 - 2;
    lVar3 = 0;
    in_DX = 0;
    do {
      in_DX = (ushort)puVar2[lVar3] | in_DX << 8;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
  }
  if (1 < uVar1) {
    *out = in_DX << 8 | in_DX >> 8;
  }
  return (uint)(1 < uVar1);
}

Assistant:

static int cbs_get(CBS *cbs, const uint8_t **p, size_t n) {
  if (cbs->len < n) {
    return 0;
  }

  *p = cbs->data;
  cbs->data += n;
  cbs->len -= n;
  return 1;
}